

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O3

void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)

{
  long lVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  byte bVar10;
  ushort uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  mz_uint32 t;
  uint uVar16;
  int iVar17;
  byte bVar18;
  long *in_RSI;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  byte *pbVar23;
  byte *pbVar24;
  byte *pbVar25;
  mz_uint32 t_1;
  
  puVar5 = (uint *)in_RSI[8];
  iVar13 = (int)pZip;
  iVar8 = iVar13 + -2 >> 1;
  if (-1 < iVar8) {
    do {
      iVar21 = iVar8 * 2 + 1;
      if (iVar21 < iVar13) {
        lVar6 = *in_RSI;
        lVar7 = in_RSI[4];
        iVar17 = iVar8;
        do {
          iVar12 = iVar17 * 2 + 2;
          uVar22 = 0;
          if (iVar12 < iVar13) {
            uVar14 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[iVar21] * 4);
            uVar19 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[iVar12] * 4);
            lVar1 = lVar6 + uVar14;
            pbVar23 = (byte *)(lVar1 + 0x2e);
            uVar3 = *(ushort *)(lVar1 + 0x1c);
            uVar4 = *(ushort *)(lVar6 + 0x1c + uVar19);
            uVar11 = uVar4;
            if (uVar3 < uVar4) {
              uVar11 = uVar3;
            }
            pbVar24 = (byte *)((ulong)uVar11 + uVar14 + lVar6 + 0x2e);
            if (uVar11 == 0) {
              bVar10 = 0;
              bVar18 = 0;
            }
            else {
              pbVar25 = (byte *)(uVar19 + lVar6 + 0x2e);
              do {
                bVar18 = *pbVar23;
                bVar10 = bVar18 + 0x20;
                if (0x19 < (byte)(bVar18 + 0xbf)) {
                  bVar10 = bVar18;
                }
                bVar2 = *pbVar25;
                bVar18 = bVar2 + 0x20;
                if (0x19 < (byte)(bVar2 + 0xbf)) {
                  bVar18 = bVar2;
                }
                if (bVar10 != bVar18) break;
                pbVar23 = pbVar23 + 1;
                pbVar25 = pbVar25 + 1;
                bVar18 = bVar10;
              } while (pbVar23 < pbVar24);
            }
            bVar15 = bVar10 < bVar18;
            if (pbVar23 == pbVar24) {
              bVar15 = uVar3 < uVar4;
            }
            uVar22 = (uint)bVar15;
          }
          iVar12 = uVar22 + iVar21;
          uVar22 = puVar5[iVar17];
          uVar19 = (ulong)*(uint *)(lVar7 + (ulong)uVar22 * 4);
          uVar14 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[iVar12] * 4);
          lVar1 = lVar6 + uVar19;
          pbVar23 = (byte *)(lVar1 + 0x2e);
          uVar3 = *(ushort *)(lVar1 + 0x1c);
          uVar4 = *(ushort *)(lVar6 + 0x1c + uVar14);
          uVar11 = uVar4;
          if (uVar3 < uVar4) {
            uVar11 = uVar3;
          }
          pbVar24 = (byte *)((ulong)uVar11 + uVar19 + lVar6 + 0x2e);
          if (uVar11 == 0) {
            bVar18 = 0;
            bVar10 = 0;
          }
          else {
            pbVar25 = (byte *)(uVar14 + lVar6 + 0x2e);
            do {
              bVar10 = *pbVar23;
              bVar18 = bVar10 + 0x20;
              if (0x19 < (byte)(bVar10 + 0xbf)) {
                bVar18 = bVar10;
              }
              bVar2 = *pbVar25;
              bVar10 = bVar2 + 0x20;
              if (0x19 < (byte)(bVar2 + 0xbf)) {
                bVar10 = bVar2;
              }
              if (bVar18 != bVar10) break;
              pbVar23 = pbVar23 + 1;
              pbVar25 = pbVar25 + 1;
              bVar10 = bVar18;
            } while (pbVar23 < pbVar24);
          }
          bVar15 = bVar10 <= bVar18;
          if (pbVar23 == pbVar24) {
            bVar15 = uVar4 <= uVar3;
          }
          if (bVar15) break;
          puVar5[iVar17] = puVar5[iVar12];
          puVar5[iVar12] = uVar22;
          iVar21 = iVar12 * 2 + 1;
          iVar17 = iVar12;
        } while (iVar21 < iVar13);
      }
      bVar15 = 0 < iVar8;
      iVar8 = iVar8 + -1;
    } while (bVar15);
  }
  if (1 < iVar13) {
    uVar14 = (ulong)pZip & 0xffffffff;
    do {
      uVar22 = puVar5[uVar14 - 1];
      puVar5[uVar14 - 1] = *puVar5;
      *puVar5 = uVar22;
      if (uVar14 < 3) {
        return;
      }
      uVar19 = uVar14 - 1;
      lVar6 = *in_RSI;
      lVar7 = in_RSI[4];
      iVar13 = 0;
      iVar21 = 1;
      iVar8 = 0;
      do {
        uVar16 = 0;
        if ((long)(iVar13 + 2) < (long)uVar19) {
          uVar9 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[iVar21] * 4);
          uVar20 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[iVar13 + 2] * 4);
          lVar1 = lVar6 + uVar9;
          pbVar23 = (byte *)(lVar1 + 0x2e);
          uVar3 = *(ushort *)(lVar1 + 0x1c);
          uVar4 = *(ushort *)(lVar6 + 0x1c + uVar20);
          uVar11 = uVar4;
          if (uVar3 < uVar4) {
            uVar11 = uVar3;
          }
          pbVar24 = (byte *)((ulong)uVar11 + uVar9 + lVar6 + 0x2e);
          if (uVar11 == 0) {
            bVar18 = 0;
            bVar10 = 0;
          }
          else {
            pbVar25 = (byte *)(uVar20 + lVar6 + 0x2e);
            do {
              bVar10 = *pbVar23;
              bVar18 = bVar10 + 0x20;
              if (0x19 < (byte)(bVar10 + 0xbf)) {
                bVar18 = bVar10;
              }
              bVar2 = *pbVar25;
              bVar10 = bVar2 + 0x20;
              if (0x19 < (byte)(bVar2 + 0xbf)) {
                bVar10 = bVar2;
              }
              if (bVar18 != bVar10) break;
              pbVar23 = pbVar23 + 1;
              pbVar25 = pbVar25 + 1;
              bVar10 = bVar18;
            } while (pbVar23 < pbVar24);
          }
          bVar15 = bVar18 < bVar10;
          if (pbVar23 == pbVar24) {
            bVar15 = uVar3 < uVar4;
          }
          uVar16 = (uint)bVar15;
        }
        iVar17 = uVar16 + iVar21;
        uVar9 = (ulong)*(uint *)(lVar7 + (ulong)uVar22 * 4);
        uVar20 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[iVar17] * 4);
        lVar1 = lVar6 + uVar9;
        pbVar23 = (byte *)(lVar1 + 0x2e);
        uVar3 = *(ushort *)(lVar1 + 0x1c);
        uVar4 = *(ushort *)(lVar6 + 0x1c + uVar20);
        uVar11 = uVar4;
        if (uVar3 < uVar4) {
          uVar11 = uVar3;
        }
        pbVar24 = (byte *)((ulong)uVar11 + uVar9 + lVar6 + 0x2e);
        if (uVar11 == 0) {
          bVar18 = 0;
          bVar10 = 0;
        }
        else {
          pbVar25 = (byte *)(uVar20 + lVar6 + 0x2e);
          do {
            bVar10 = *pbVar23;
            bVar18 = bVar10 + 0x20;
            if (0x19 < (byte)(bVar10 + 0xbf)) {
              bVar18 = bVar10;
            }
            bVar2 = *pbVar25;
            bVar10 = bVar2 + 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar10 = bVar2;
            }
            if (bVar18 != bVar10) break;
            pbVar23 = pbVar23 + 1;
            pbVar25 = pbVar25 + 1;
            bVar10 = bVar18;
          } while (pbVar23 < pbVar24);
        }
        bVar15 = bVar10 <= bVar18;
        if (pbVar23 == pbVar24) {
          bVar15 = uVar4 <= uVar3;
        }
        if (bVar15) break;
        puVar5[iVar8] = puVar5[iVar17];
        puVar5[iVar17] = uVar22;
        iVar13 = iVar17 * 2;
        iVar21 = iVar17 * 2 + 1;
        iVar8 = iVar17;
      } while ((long)iVar21 < (long)uVar19);
      bVar15 = 2 < uVar14;
      uVar14 = uVar19;
    } while (bVar15);
  }
  return;
}

Assistant:

static void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)
{
    mz_zip_internal_state *pState = pZip->m_pState;
    const mz_zip_array *pCentral_dir_offsets = &pState->m_central_dir_offsets;
    const mz_zip_array *pCentral_dir = &pState->m_central_dir;
    mz_uint32 *pIndices;
    mz_uint32 start, end;
    const mz_uint32 size = pZip->m_total_files;

    if (size <= 1U)
        return;

    pIndices = &MZ_ZIP_ARRAY_ELEMENT(&pState->m_sorted_central_dir_offsets, mz_uint32, 0);

    start = (size - 2U) >> 1U;
    for (;;)
    {
        mz_uint64 child, root = start;
        for (;;)
        {
            if ((child = (root << 1U) + 1U) >= size)
                break;
            child += (((child + 1U) < size) && (mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[child], pIndices[child + 1U])));
            if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
                break;
            MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
            root = child;
        }
        if (!start)
            break;
        start--;
    }

    end = size - 1;
    while (end > 0)
    {
        mz_uint64 child, root = 0;
        MZ_SWAP_UINT32(pIndices[end], pIndices[0]);
        for (;;)
        {
            if ((child = (root << 1U) + 1U) >= end)
                break;
            child += (((child + 1U) < end) && mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[child], pIndices[child + 1U]));
            if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets, pIndices[root], pIndices[child]))
                break;
            MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
            root = child;
        }
        end--;
    }
}